

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::TypedAttributeWithFallback<std::array<float,_4UL>_>::TypedAttributeWithFallback
          (TypedAttributeWithFallback<std::array<float,_4UL>_> *this,array<float,_4UL> *fallback)

{
  array<float,_4UL> *fallback_local;
  TypedAttributeWithFallback<std::array<float,_4UL>_> *this_local;
  
  AttrMetas::AttrMetas(&this->_metas);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector(&this->_paths);
  nonstd::optional_lite::optional<std::array<float,_4UL>_>::optional(&this->_attrib);
  this->_empty = false;
  *(undefined8 *)(this->_fallback)._M_elems = *(undefined8 *)fallback->_M_elems;
  *(undefined8 *)((this->_fallback)._M_elems + 2) = *(undefined8 *)(fallback->_M_elems + 2);
  this->_blocked = false;
  return;
}

Assistant:

TypedAttributeWithFallback(const T &fallback) : _fallback(fallback) {}